

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,int location,QColor *color)

{
  long lVar1;
  QOpenGLShaderProgramPrivate *pQVar2;
  QOpenGLFunctions *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  QOpenGLShaderProgramPrivate *d;
  GLfloat values [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QOpenGLShaderProgram *)0x1767ee);
  if (in_ESI != -1) {
    QColor::redF();
    QColor::greenF();
    QColor::blueF();
    QColor::alphaF();
    QOpenGLFunctions::glUniform4fv
              (in_RDX,(GLint)((ulong)pQVar2 >> 0x20),(GLsizei)pQVar2,(GLfloat *)0x17686f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(int location, const QColor& color)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        GLfloat values[4] = {GLfloat(color.redF()), GLfloat(color.greenF()),
                             GLfloat(color.blueF()), GLfloat(color.alphaF())};
        d->glfuncs->glUniform4fv(location, 1, values);
    }
}